

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

int __thiscall HighFreqSub::deregister(HighFreqSub *this)

{
  int iVar1;
  char *__s1;
  HighFreqDataType local_a0;
  
  HighFreqDataType::HighFreqDataType(&local_a0);
  std::__cxx11::string::_M_assign((string *)&(this->dt).name);
  std::__cxx11::string::_M_assign((string *)&(this->dt).origin);
  std::__cxx11::string::_M_assign((string *)&(this->dt).dataFormat);
  std::__cxx11::string::_M_assign((string *)&(this->dt).sockAddr);
  (this->dt).byteSize = local_a0.byteSize;
  HighFreqDataType::~HighFreqDataType(&local_a0);
  zstr_send(this->actor,"$DRG");
  __s1 = zstr_recv(this->actor);
  iVar1 = strcmp(__s1,"$DRGD");
  free(__s1);
  return -(uint)(iVar1 != 0);
}

Assistant:

int HighFreqSub::deregister(){
    dt = HighFreqDataType();
    zstr_send(actor, deregdt);
    char * recv = zstr_recv(actor);
    if(streq(recv, deregdone)){
        freen(recv);
        return 0;
    }else{
        freen(recv);
        return -1;
    }
}